

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

void * lys_ext_complex_get_substmt(LY_STMT stmt,lys_ext_instance_complex *ext,lyext_substmt **info)

{
  int local_2c;
  int i;
  lyext_substmt **info_local;
  lys_ext_instance_complex *ext_local;
  char *pcStack_10;
  LY_STMT stmt_local;
  
  if ((((ext == (lys_ext_instance_complex *)0x0) || (ext->def == (lys_ext *)0x0)) ||
      (ext->def->plugin == (lyext_plugin *)0x0)) || (ext->def->plugin->type != LYEXT_COMPLEX)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "lys_ext_complex_get_substmt");
    pcStack_10 = (char *)0x0;
  }
  else if (ext->substmt == (lyext_substmt *)0x0) {
    if (info != (lyext_substmt **)0x0) {
      *info = (lyext_substmt *)0x0;
    }
    pcStack_10 = (char *)0x0;
  }
  else {
    local_2c = 0;
    while (ext->substmt[local_2c].stmt != LY_STMT_UNKNOWN) {
      if (stmt == LY_STMT_NODE) {
        if ((LY_STMT_MODULE < ext->substmt[local_2c].stmt) &&
           (ext->substmt[local_2c].stmt < LY_STMT_TYPEDEF)) {
          if (info != (lyext_substmt **)0x0) {
            *info = ext->substmt + local_2c;
          }
          break;
        }
      }
      else if (ext->substmt[local_2c].stmt == stmt) {
        if (info != (lyext_substmt **)0x0) {
          *info = ext->substmt + local_2c;
        }
        break;
      }
      local_2c = local_2c + 1;
    }
    if (ext->substmt[local_2c].stmt == LY_STMT_UNKNOWN) {
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = ext->content + ext->substmt[local_2c].offset;
    }
  }
  return pcStack_10;
}

Assistant:

API void *
lys_ext_complex_get_substmt(LY_STMT stmt, struct lys_ext_instance_complex *ext, struct lyext_substmt **info)
{
    int i;

    if (!ext || !ext->def || !ext->def->plugin || ext->def->plugin->type != LYEXT_COMPLEX) {
        LOGARG;
        return NULL;
    }

    if (!ext->substmt) {
        /* no substatement defined in the plugin */
        if (info) {
            *info = NULL;
        }
        return NULL;
    }

    /* search the substatements defined by the plugin */
    for (i = 0; ext->substmt[i].stmt; i++) {
        if (stmt == LY_STMT_NODE) {
            if (ext->substmt[i].stmt >= LY_STMT_ACTION && ext->substmt[i].stmt <= LY_STMT_USES) {
                if (info) {
                    *info = &ext->substmt[i];
                }
                break;
            }
        } else if (ext->substmt[i].stmt == stmt) {
            if (info) {
                *info = &ext->substmt[i];
            }
            break;
        }
    }

    if (ext->substmt[i].stmt) {
        return &ext->content[ext->substmt[i].offset];
    } else {
        return NULL;
    }
}